

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O2

void ucnv_fromUnicode_UTF8_OFFSETS_LOGIC_63(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  UChar UVar2;
  UConverter *pUVar3;
  UChar *pUVar4;
  byte *pbVar5;
  UChar *pUVar6;
  UChar *pUVar7;
  int *piVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  byte *pbVar13;
  uint uVar14;
  byte *pbVar15;
  ulong uVar16;
  long lVar17;
  byte bVar18;
  uint uVar19;
  byte *pbVar20;
  byte local_44 [4];
  UConverterSharedData *local_40;
  UConverterFromUnicodeArgs *local_38;
  uint8_t tempBuf [4];
  
  pUVar3 = args->converter;
  pUVar7 = args->source;
  piVar9 = args->offsets;
  pUVar4 = args->sourceLimit;
  pbVar13 = (byte *)args->target;
  local_38 = args;
  pbVar5 = (byte *)args->targetLimit;
  local_40 = pUVar3->sharedData;
  uVar19 = pUVar3->fromUChar32;
  iVar10 = 0;
  if (pbVar5 <= pbVar13 || uVar19 == 0) goto LAB_0031f4fe;
  pUVar3->fromUChar32 = 0;
  iVar12 = 0;
  iVar10 = -1;
  piVar8 = piVar9;
LAB_0031f60e:
  pUVar6 = pUVar7;
  pbVar20 = pbVar13;
  if (pUVar7 < pUVar4) {
    if (((uVar19 >> 10 & 1) == 0) && (((ushort)*pUVar7 & 0xfc00) == 0xdc00)) {
      uVar19 = uVar19 * 0x400 + (uint)(ushort)*pUVar7 + 0xfca02400;
      pUVar7 = pUVar7 + 1;
      piVar9 = piVar8;
      iVar12 = iVar12 + 1;
      iVar11 = iVar10;
LAB_0031f651:
      iVar10 = iVar12;
      pbVar20 = local_44;
      if (3 < (long)pbVar5 - (long)pbVar13) {
        pbVar20 = pbVar13;
      }
      if ((int)uVar19 < 0x10000) {
        bVar18 = (byte)(uVar19 >> 0xc) | 0xe0;
        uVar14 = 2;
      }
      else {
        bVar18 = (byte)(uVar19 >> 0x12) | 0xf0;
        pbVar15 = local_44;
        if (3 < (long)pbVar5 - (long)pbVar13) {
          pbVar15 = pbVar13;
        }
        pbVar15[1] = (byte)(uVar19 >> 0xc) & 0x3f | 0x80;
        uVar14 = 3;
      }
      *pbVar20 = bVar18;
      uVar16 = (ulong)uVar14;
      pbVar20[uVar16 - 1] = (byte)(uVar19 >> 6) & 0x3f | 0x80;
      pbVar20[uVar16] = (byte)uVar19 & 0x3f | 0x80;
      if (pbVar20 == pbVar13) {
        pbVar13 = pbVar13 + uVar16 + 1;
        *piVar9 = iVar11;
        piVar9[1] = iVar11;
        piVar9[2] = iVar11;
        if (0xffff < (int)uVar19) {
          piVar9[3] = iVar11;
        }
        piVar9 = piVar9 + uVar16 + 1;
      }
      else {
        for (; pbVar20 <= local_44 + uVar16; pbVar20 = pbVar20 + 1) {
          if (pbVar13 < pbVar5) {
            *piVar9 = iVar11;
            piVar9 = piVar9 + 1;
            *pbVar13 = *pbVar20;
            pbVar13 = pbVar13 + 1;
          }
          else {
            bVar18 = *pbVar20;
            cVar1 = pUVar3->charErrorBufferLength;
            pUVar3->charErrorBufferLength = cVar1 + '\x01';
            pUVar3->charErrorBuffer[cVar1] = bVar18;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
        }
      }
LAB_0031f4fe:
      do {
        lVar17 = 0;
        pUVar6 = pUVar7;
        piVar8 = piVar9;
        while( true ) {
          pbVar20 = pbVar13 + lVar17;
          if ((pUVar4 <= pUVar6) || (pbVar5 <= pbVar20)) goto LAB_0031f5b2;
          UVar2 = pUVar7[lVar17];
          uVar19 = (uint)(ushort)UVar2;
          pbVar20 = pbVar13 + lVar17 + 1;
          bVar18 = (byte)UVar2;
          if (uVar19 < 0x80) {
            *piVar8 = iVar10;
            piVar8 = piVar8 + 1;
            pbVar13[lVar17] = bVar18;
            goto LAB_0031f59b;
          }
          if (0x7ff < (ushort)UVar2) {
            iVar12 = iVar10 + 1;
            pbVar13 = pbVar13 + lVar17;
            pUVar7 = pUVar6 + 1;
            piVar9 = piVar8;
            iVar11 = iVar10;
            if ((local_40 == &_CESU8Data_63) || ((uVar19 & 0xf800) != 0xd800)) goto LAB_0031f651;
            goto LAB_0031f60e;
          }
          piVar9[lVar17] = iVar10;
          pbVar13[lVar17] = (byte)((ushort)UVar2 >> 6) | 0xc0;
          if (pbVar20 < pbVar5) break;
          pUVar6 = pUVar6 + 1;
          piVar8 = piVar8 + 1;
          pUVar3->charErrorBuffer[0] = bVar18 & 0x3f | 0x80;
          pUVar3->charErrorBufferLength = '\x01';
          *err = U_BUFFER_OVERFLOW_ERROR;
          lVar17 = lVar17 + 1;
        }
        piVar8 = piVar8 + 2;
        piVar9[lVar17 + 1] = iVar10;
        pbVar20 = pbVar13 + lVar17 + 2;
        pbVar13[lVar17 + 1] = bVar18 & 0x3f | 0x80;
LAB_0031f59b:
        iVar10 = iVar10 + 1;
        pUVar7 = pUVar6 + 1;
        piVar9 = piVar8;
        pbVar13 = pbVar20;
      } while( true );
    }
    pUVar3->fromUChar32 = uVar19;
    *err = U_ILLEGAL_CHAR_FOUND;
  }
  else {
    pUVar3->fromUChar32 = uVar19;
  }
LAB_0031f5b2:
  if (((pUVar6 < pUVar4) && (pbVar5 <= pbVar20)) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    *err = U_BUFFER_OVERFLOW_ERROR;
  }
  local_38->target = (char *)pbVar20;
  local_38->source = pUVar6;
  local_38->offsets = piVar8;
  return;
}

Assistant:

U_CFUNC void  U_CALLCONV ucnv_fromUnicode_UTF8_OFFSETS_LOGIC (UConverterFromUnicodeArgs * args,
                                                  UErrorCode * err)
{
    UConverter *cnv = args->converter;
    const UChar *mySource = args->source;
    int32_t *myOffsets = args->offsets;
    const UChar *sourceLimit = args->sourceLimit;
    uint8_t *myTarget = (uint8_t *) args->target;
    const uint8_t *targetLimit = (uint8_t *) args->targetLimit;
    uint8_t *tempPtr;
    UChar32 ch;
    int32_t offsetNum, nextSourceIndex;
    int32_t indexToWrite;
    uint8_t tempBuf[4];
    UBool isNotCESU8 = !hasCESU8Data(cnv);

    if (cnv->fromUChar32 && myTarget < targetLimit)
    {
        ch = cnv->fromUChar32;
        cnv->fromUChar32 = 0;
        offsetNum = -1;
        nextSourceIndex = 0;
        goto lowsurrogate;
    } else {
        offsetNum = 0;
    }

    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        ch = *(mySource++);

        if (ch < 0x80)        /* Single byte */
        {
            *(myOffsets++) = offsetNum++;
            *(myTarget++) = (char) ch;
        }
        else if (ch < 0x800)  /* Double byte */
        {
            *(myOffsets++) = offsetNum;
            *(myTarget++) = (uint8_t) ((ch >> 6) | 0xc0);
            if (myTarget < targetLimit)
            {
                *(myOffsets++) = offsetNum++;
                *(myTarget++) = (uint8_t) ((ch & 0x3f) | 0x80);
            }
            else
            {
                cnv->charErrorBuffer[0] = (uint8_t) ((ch & 0x3f) | 0x80);
                cnv->charErrorBufferLength = 1;
                *err = U_BUFFER_OVERFLOW_ERROR;
            }
        }
        else
        /* Check for surrogates */
        {
            nextSourceIndex = offsetNum + 1;

            if(U16_IS_SURROGATE(ch) && isNotCESU8) {
lowsurrogate:
                if (mySource < sourceLimit) {
                    /* test both code units */
                    if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(*mySource)) {
                        /* convert and consume this supplementary code point */
                        ch=U16_GET_SUPPLEMENTARY(ch, *mySource);
                        ++mySource;
                        ++nextSourceIndex;
                        /* exit this condition tree */
                    }
                    else {
                        /* this is an unpaired trail or lead code unit */
                        /* callback(illegal) */
                        cnv->fromUChar32 = ch;
                        *err = U_ILLEGAL_CHAR_FOUND;
                        break;
                    }
                }
                else {
                    /* no more input */
                    cnv->fromUChar32 = ch;
                    break;
                }
            }

            /* Do we write the buffer directly for speed,
            or do we have to be careful about target buffer space? */
            tempPtr = (((targetLimit - myTarget) >= 4) ? myTarget : tempBuf);

            if (ch <= MAXIMUM_UCS2) {
                indexToWrite = 2;
                tempPtr[0] = (uint8_t) ((ch >> 12) | 0xe0);
            }
            else {
                indexToWrite = 3;
                tempPtr[0] = (uint8_t) ((ch >> 18) | 0xf0);
                tempPtr[1] = (uint8_t) (((ch >> 12) & 0x3f) | 0x80);
            }
            tempPtr[indexToWrite-1] = (uint8_t) (((ch >> 6) & 0x3f) | 0x80);
            tempPtr[indexToWrite] = (uint8_t) ((ch & 0x3f) | 0x80);

            if (tempPtr == myTarget) {
                /* There was enough space to write the codepoint directly. */
                myTarget += (indexToWrite + 1);
                myOffsets[0] = offsetNum;
                myOffsets[1] = offsetNum;
                myOffsets[2] = offsetNum;
                if (indexToWrite >= 3) {
                    myOffsets[3] = offsetNum;
                }
                myOffsets += (indexToWrite + 1);
            }
            else {
                /* We might run out of room soon. Write it slowly. */
                for (; tempPtr <= (tempBuf + indexToWrite); tempPtr++) {
                    if (myTarget < targetLimit)
                    {
                        *(myOffsets++) = offsetNum;
                        *(myTarget++) = *tempPtr;
                    }
                    else
                    {
                        cnv->charErrorBuffer[cnv->charErrorBufferLength++] = *tempPtr;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }
            }
            offsetNum = nextSourceIndex;
        }
    }

    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = (char *) myTarget;
    args->source = mySource;
    args->offsets = myOffsets;
}